

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O0

void __thiscall gui::Panel::Panel(Panel *this,shared_ptr<gui::PanelStyle> *style,String *name)

{
  Group *in_RSI;
  undefined8 *in_RDI;
  String *in_stack_ffffffffffffffb8;
  
  Group::Group(in_RSI,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__Panel_002f7c40;
  in_RDI[4] = &PTR__Panel_002f7cc0;
  std::shared_ptr<gui::PanelStyle>::shared_ptr
            ((shared_ptr<gui::PanelStyle> *)in_RSI,
             (shared_ptr<gui::PanelStyle> *)in_stack_ffffffffffffffb8);
  *(undefined1 *)(in_RDI + 0x42) = 0;
  sf::Vector2<float>::Vector2((Vector2<float> *)((long)in_RDI + 0x214));
  return;
}

Assistant:

Panel::Panel(std::shared_ptr<PanelStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false) {
}